

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

int32_t internal_exr_compute_chunk_offset_size(exr_priv_part_t curpart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  exr_attr_chlist_t *peVar5;
  exr_attr_tiledesc_t *peVar6;
  exr_attr_chlist_entry_t *peVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint64_t uVar20;
  ulong uVar21;
  int16_t iVar22;
  ulong uVar23;
  int iVar24;
  
  if (curpart->storage_mode == EXR_STORAGE_UNKNOWN) {
    iVar10 = 0;
    if (0 < curpart->chunk_count) {
      iVar10 = curpart->chunk_count;
    }
  }
  else {
    peVar5 = (curpart->channels->field_6).chlist;
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      iVar10 = (curpart->data_window).min.y;
      iVar1 = (curpart->data_window).max.y;
      iVar2 = (curpart->data_window).min.x;
      iVar3 = (curpart->data_window).max.x;
      uVar8 = exr_compression_lines_per_chunk(curpart->comp_type);
      curpart->lines_per_chunk = (int16_t)uVar8;
      if ((int)uVar8 < 0) {
        iVar10 = -1;
      }
      else {
        iVar17 = (iVar3 - iVar2) + 1;
        uVar14 = (uVar8 + iVar10) - 1;
        uVar19 = 1 - (uVar8 + iVar10);
        if (0 < (int)(uVar8 + iVar10)) {
          uVar19 = uVar14;
        }
        uVar18 = 0;
        uVar11 = (ulong)(uint)peVar5->num_channels;
        if (peVar5->num_channels < 1) {
          uVar11 = uVar18;
        }
        iVar22 = 0;
        uVar20 = 0;
        for (; uVar11 << 5 != uVar18; uVar18 = uVar18 + 0x20) {
          peVar7 = peVar5->entries;
          iVar15 = *(int *)(peVar7->reserved + uVar18 + 3);
          uVar4 = *(uint *)(peVar7->reserved + uVar18 + 7);
          iVar9 = 1;
          if (iVar15 < 2) {
            iVar9 = iVar17;
          }
          if (1 < iVar15 && iVar3 != iVar2) {
            iVar9 = iVar17 / iVar15;
          }
          uVar13 = uVar8;
          if (1 < (int)uVar4) {
            iVar15 = iVar10 % (int)uVar4;
            if (uVar8 == 1) {
              uVar13 = (uint)(iVar15 == 0);
            }
            else {
              iVar24 = uVar4 - iVar15;
              if (iVar15 == 0) {
                iVar24 = 0;
              }
              uVar13 = 0;
              iVar15 = uVar14 - uVar19 % uVar4;
              if (iVar24 + iVar10 <= iVar15) {
                uVar13 = (iVar15 - (iVar24 + iVar10)) / (int)uVar4 + 1;
              }
            }
          }
          if (1 < (int)uVar4) {
            iVar22 = 1;
          }
          uVar20 = uVar20 + ((long)iVar9 <<
                            (2U - (*(int *)(peVar7->reserved + (uVar18 - 5)) == 1) & 0x3f)) *
                            (long)(int)uVar13;
        }
        curpart->unpacked_size_per_chunk = uVar20;
        curpart->chan_has_line_sampling = iVar22;
        iVar10 = (int)((iVar1 - iVar10) + uVar8) / (int)uVar8;
      }
    }
    else {
      peVar6 = (curpart->tiles->field_6).tiledesc;
      bVar12 = peVar6->level_and_round & 0xf;
      if (bVar12 < 2) {
        uVar18 = 0;
        uVar11 = (ulong)(uint)curpart->num_tile_levels_x;
        if (curpart->num_tile_levels_x < 1) {
          uVar11 = uVar18;
        }
        lVar16 = 0;
        for (; uVar11 != uVar18; uVar18 = uVar18 + 1) {
          lVar16 = lVar16 + (long)curpart->tile_level_tile_count_y[uVar18] *
                            (long)curpart->tile_level_tile_count_x[uVar18];
        }
        if (0x7fffffff < lVar16) {
          return -1;
        }
      }
      else {
        if (bVar12 != 2) {
          return -1;
        }
        uVar11 = (ulong)(uint)curpart->num_tile_levels_x;
        if (curpart->num_tile_levels_x < 1) {
          uVar11 = 0;
        }
        lVar16 = 0;
        for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
          uVar21 = (ulong)(uint)curpart->num_tile_levels_y;
          if (curpart->num_tile_levels_y < 1) {
            uVar21 = 0;
          }
          uVar23 = 0;
          while (uVar21 != uVar23) {
            lVar16 = lVar16 + (long)curpart->tile_level_tile_count_y[uVar23] *
                              (long)curpart->tile_level_tile_count_x[uVar18];
            uVar23 = uVar23 + 1;
            if (0x7fffffff < lVar16) {
              return -1;
            }
          }
        }
      }
      uVar18 = 0;
      uVar11 = (ulong)(uint)peVar5->num_channels;
      if (peVar5->num_channels < 1) {
        uVar11 = uVar18;
      }
      uVar20 = 0;
      for (; uVar11 * 0x20 != uVar18; uVar18 = uVar18 + 0x20) {
        uVar20 = uVar20 + (ulong)peVar6->y_size *
                          ((ulong)peVar6->x_size <<
                          (2U - (*(int *)(peVar5->entries->reserved + (uVar18 - 5)) == 1) & 0x3f));
      }
      curpart->unpacked_size_per_chunk = uVar20;
      curpart->chan_has_line_sampling = 0;
      iVar10 = (int)lVar16;
    }
  }
  return iVar10;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (exr_priv_part_t curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    if (curpart->storage_mode == EXR_STORAGE_UNKNOWN)
    {
        if (curpart->chunk_count > 0)
            return curpart->chunk_count;
        return 0;
    }

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            /* tiles do not allow x/y sub sampling */
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) tiledesc->x_size;
            cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        int linePerChunk, h;

        linePerChunk = exr_compression_lines_per_chunk (curpart->comp_type);

        curpart->lines_per_chunk = linePerChunk;

        if (linePerChunk < 0) return -1;

        for (int c = 0; c < channels->num_channels; ++c)
        {
            int xsamp  = channels->entries[c].x_sampling;
            int ysamp  = channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (uint64_t) compute_sampled_width (w, xsamp, dw.min.x);
            cunpsz *= (uint64_t) compute_sampled_height (linePerChunk, ysamp, dw.min.y);
            if (ysamp > 1)
                hasLineSample = 1;
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}